

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_sub_tri_complexity
          (REF_INT n0,REF_INT n1,REF_INT n2,REF_INT *nodes,REF_DBL *metric,REF_DBL *complexity,
          REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tri_nodes [3];
  REF_INT cell_node;
  REF_DBL det;
  REF_DBL volume;
  REF_DBL *complexity_local;
  REF_DBL *metric_local;
  REF_INT *nodes_local;
  REF_INT n2_local;
  REF_INT n1_local;
  REF_INT n0_local;
  
  ref_private_macro_code_rss_1 = nodes[n0];
  ref_private_macro_code_rss = nodes[n1];
  tri_nodes[0] = nodes[n2];
  volume = (REF_DBL)complexity;
  complexity_local = metric;
  metric_local = (REF_DBL *)nodes;
  nodes_local._0_4_ = n2;
  nodes_local._4_4_ = n1;
  n2_local = n0;
  uVar1 = ref_node_tri_area(ref_node,&ref_private_macro_code_rss_1,&det);
  if (uVar1 == 0) {
    for (tri_nodes[1] = 0; tri_nodes[1] < 3; tri_nodes[1] = tri_nodes[1] + 1) {
      if (ref_node->ref_mpi->id == ref_node->part[(&ref_private_macro_code_rss_1)[tri_nodes[1]]]) {
        uVar1 = ref_matrix_det_m(complexity_local +
                                 (&ref_private_macro_code_rss_1)[tri_nodes[1]] * 6,
                                 (REF_DBL *)(tri_nodes + 2));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x756,"ref_metric_sub_tri_complexity",(ulong)uVar1,"det");
          return uVar1;
        }
        if (0.0 < stack0xffffffffffffffc0) {
          dVar2 = sqrt(stack0xffffffffffffffc0);
          *(double *)volume = (dVar2 * det) / 3.0 + *(double *)volume;
        }
      }
    }
    n1_local = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x753,
           "ref_metric_sub_tri_complexity",(ulong)uVar1,"vol");
    n1_local = uVar1;
  }
  return n1_local;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_sub_tri_complexity(
    REF_INT n0, REF_INT n1, REF_INT n2, REF_INT *nodes, REF_DBL *metric,
    REF_DBL *complexity, REF_NODE ref_node) {
  REF_DBL volume, det;
  REF_INT cell_node;
  REF_INT tri_nodes[3];
  tri_nodes[0] = nodes[n0];
  tri_nodes[1] = nodes[n1];
  tri_nodes[2] = nodes[n2];
  RSS(ref_node_tri_area(ref_node, tri_nodes, &volume), "vol");
  for (cell_node = 0; cell_node < 3; cell_node++) {
    if (ref_node_owned(ref_node, tri_nodes[cell_node])) {
      RSS(ref_matrix_det_m(&(metric[6 * tri_nodes[cell_node]]), &det), "det");
      if (det > 0.0) {
        (*complexity) += sqrt(det) * volume / 3.0;
      }
    }
  }

  return REF_SUCCESS;
}